

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatcoe.c
# Opt level: O1

int ecx_readOEsingle(ecx_contextt *context,uint16 Item,uint8 SubI,ec_ODlistt *pODlist,
                    ec_OElistt *pOElist)

{
  uint16 Index;
  ushort uVar1;
  uint8 uVar2;
  uint uVar3;
  ushort uVar4;
  undefined6 in_register_00000032;
  ec_mbxbuft MbxIn;
  ec_mbxbuft MbxOut;
  ec_errort local_854;
  short local_838 [2];
  byte local_833;
  byte local_830;
  undefined4 local_82c;
  uint16 local_828;
  uint16 local_826;
  uint16 local_824;
  char local_822 [1002];
  uint8 local_438 [5];
  byte local_433;
  uint8 local_432 [6];
  uint16 local_42c;
  uint8 local_42a;
  uint8 local_429;
  
  uVar4 = pODlist->Slave;
  Index = pODlist->Index[CONCAT62(in_register_00000032,Item) & 0xffffffff];
  ec_clearmbx((ec_mbxbuft *)local_838);
  ecx_mbxreceive(context,uVar4,(ec_mbxbuft *)local_838,0);
  ec_clearmbx((ec_mbxbuft *)local_438);
  local_438[0] = '\n';
  local_438[1] = '\0';
  local_438[2] = '\0';
  local_438[3] = '\0';
  local_438[4] = '\0';
  uVar2 = ec_nextmbxcnt(context->slavelist[uVar4].mbx_cnt);
  context->slavelist[uVar4].mbx_cnt = uVar2;
  local_433 = uVar2 << 4 | 3;
  local_432[0] = '\0';
  local_432[1] = 0x80;
  local_432[2] = '\x05';
  local_432[3] = '\0';
  local_432[4] = '\0';
  local_432[5] = '\0';
  local_429 = '\a';
  local_42c = Index;
  local_42a = SubI;
  uVar3 = ecx_mbxsend(context,uVar4,(ec_mbxbuft *)local_438,20000);
  if ((short)uVar3 != 0) {
    ec_clearmbx((ec_mbxbuft *)local_838);
    uVar3 = ecx_mbxreceive(context,uVar4,(ec_mbxbuft *)local_838,700000);
    if ((short)uVar3 != 0) {
      if (((local_833 & 0xf) == 3) && ((local_830 & 0x7f) == 6)) {
        pOElist->Entries = pOElist->Entries + 1;
        uVar4 = 0x28;
        if ((short)(local_838[0] - 0x10U) < 0x28) {
          uVar4 = local_838[0] - 0x10U;
        }
        uVar1 = 0;
        if (0 < (short)uVar4) {
          uVar1 = uVar4;
        }
        pOElist->ValueInfo[SubI] = local_82c._3_1_;
        pOElist->DataType[SubI] = local_828;
        pOElist->BitLength[SubI] = local_826;
        pOElist->ObjAccess[SubI] = local_824;
        strncpy(pOElist->Name[SubI],local_822,(ulong)uVar1);
        pOElist->Name[SubI][uVar1] = '\0';
      }
      else {
        if ((local_830 & 0x7f) == 7) {
          *context->ecaterror = '\x01';
          local_854.Etype = EC_ERR_TYPE_SDOINFO_ERROR;
          local_854.field_6.AbortCode = local_82c;
          local_854.Slave = uVar4;
          local_854.Index = Index;
          local_854.SubIdx = SubI;
          ecx_pusherror(context,&local_854);
        }
        else {
          ecx_packeterror(context,uVar4,Index,SubI,1);
        }
        uVar3 = 0;
      }
    }
  }
  return uVar3 & 0xffff;
}

Assistant:

int ecx_readOEsingle(ecx_contextt *context, uint16 Item, uint8 SubI, ec_ODlistt *pODlist, ec_OElistt *pOElist)
{
   ec_SDOservicet *SDOp, *aSDOp;
   uint16 wkc, Index, Slave;
   int16 n;
   ec_mbxbuft MbxIn, MbxOut;
   uint8 cnt;

   wkc = 0;
   Slave = pODlist->Slave;
   Index = pODlist->Index[Item];
   ec_clearmbx(&MbxIn);
   /* clear pending out mailbox in slave if available. Timeout is set to 0 */
   wkc = ecx_mbxreceive(context, Slave, &MbxIn, 0);
   ec_clearmbx(&MbxOut);
   aSDOp = (ec_SDOservicet*)&MbxIn;
   SDOp = (ec_SDOservicet*)&MbxOut;
   SDOp->MbxHeader.length = htoes(0x000a);
   SDOp->MbxHeader.address = htoes(0x0000);
   SDOp->MbxHeader.priority = 0x00;
   /* Get new mailbox counter value */
   cnt = ec_nextmbxcnt(context->slavelist[Slave].mbx_cnt);
   context->slavelist[Slave].mbx_cnt = cnt;
   SDOp->MbxHeader.mbxtype = ECT_MBXT_COE + (cnt << 4); /* CoE */
   SDOp->CANOpen = htoes(0x000 + (ECT_COES_SDOINFO << 12)); /* number 9bits service upper 4 bits */
   SDOp->Opcode = ECT_GET_OE_REQ; /* get object entry description request */
   SDOp->Reserved = 0;
   SDOp->Fragments = 0;      /* fragments left */
   SDOp->wdata[0] = htoes(Index);      /* Index */
   SDOp->bdata[2] = SubI;       /* SubIndex */
   SDOp->bdata[3] = 1 + 2 + 4; /* get access rights, object category, PDO */
   /* send get object entry description request to slave */
   wkc = ecx_mbxsend(context, Slave, &MbxOut, EC_TIMEOUTTXM);
   /* mailbox placed in slave ? */
   if (wkc > 0)
   {
      ec_clearmbx(&MbxIn);
      /* read slave response */
      wkc = ecx_mbxreceive(context, Slave, &MbxIn, EC_TIMEOUTRXM);
      /* got response ? */
      if (wkc > 0)
      {
         if (((aSDOp->MbxHeader.mbxtype & 0x0f) == ECT_MBXT_COE) &&
             ((aSDOp->Opcode &  0x7f) == ECT_GET_OE_RES))
         {
            pOElist->Entries++;
            n = (etohs(aSDOp->MbxHeader.length) - 16); /* length of string(name of object) */
            if (n > EC_MAXNAME)
            {
               n = EC_MAXNAME; /* max string length */
            }
            if (n < 0 )
            {
               n = 0;
            }
            pOElist->ValueInfo[SubI] = aSDOp->bdata[3];
            pOElist->DataType[SubI] = etohs(aSDOp->wdata[2]);
            pOElist->BitLength[SubI] = etohs(aSDOp->wdata[3]);
            pOElist->ObjAccess[SubI] = etohs(aSDOp->wdata[4]);

            strncpy(pOElist->Name[SubI] , (char *)&aSDOp->wdata[5], n);
            pOElist->Name[SubI][n] = 0x00; /* string terminator */
         }
         /* got unexpected response from slave */
         else
         {
            if (((aSDOp->Opcode & 0x7f) == ECT_SDOINFO_ERROR)) /* SDO info error received */
            {
               ecx_SDOinfoerror(context, Slave, Index, SubI, etohl(aSDOp->ldata[0]));
            }
            else
            {
               ecx_packeterror(context, Slave, Index, SubI, 1); /* Unexpected frame returned */
            }
            wkc = 0;
         }
      }
   }
   
   return wkc;
}